

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

decimal_fp<float> fmt::v8::detail::dragonbox::to_decimal<float>(float x)

{
  carrier_uint two_f;
  undefined1 auVar1 [16];
  carrier_uint two_f_00;
  bool bVar2;
  uint uVar3;
  byte bVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int minus_k;
  uint uVar12;
  ulong uVar13;
  int beta_minus_1;
  uint uVar14;
  cache_entry_type cache;
  ulong local_38;
  
  uVar3 = (uint)x & 0x7fffff;
  if (((uint)x & 0x7f800000) == 0) {
    uVar6 = 0xffffff6b;
    if (uVar3 == 0) {
      uVar13 = 0;
      uVar3 = 0;
      goto LAB_0010f4d4;
    }
LAB_0010f20f:
    uVar12 = (int)(uVar6 * 0x134413) >> 0x16;
    uVar13 = (ulong)uVar12;
    minus_k = uVar12 - 1;
    local_38 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                         (ulong)(0x20 - uVar12) * 8);
    beta_minus_1 = ((int)((1 - uVar12) * 0x1a934f) >> 0x13) + uVar6;
    two_f_00 = uVar3 * 2;
    two_f = uVar3 * 2 + 1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_38;
    auVar1 = ZEXT416(two_f << ((byte)beta_minus_1 & 0x1f)) * auVar1;
    uVar9 = auVar1._8_8_ * 0x51eb851f;
    uVar10 = uVar9 >> 0x25;
    uVar3 = (uint)(uVar9 >> 0x20);
    uVar14 = (uVar3 >> 5) * -100 + auVar1._8_4_;
    uVar7 = (uint)(local_38 >> (~(byte)beta_minus_1 & 0x3f));
    uVar8 = uVar3 >> 5;
    if (uVar7 < uVar14) {
LAB_0010f44b:
      uVar3 = (uVar14 - (uVar7 >> 1)) + 5;
      if ((uVar3 & 1) == 0) {
        uVar7 = (uVar3 >> 1) * 0xcccd;
        uVar8 = (uVar7 >> 0x12) + uVar8 * 10;
        uVar3 = uVar8;
        if ((uVar7 & 0xfffc) < 0x3334) {
          bVar2 = cache_accessor<float>::compute_mul_parity(two_f_00,&local_38,beta_minus_1);
          if (bVar2) {
            bVar2 = is_center_integer<float>(two_f_00,uVar6,minus_k);
            uVar3 = uVar8 & 0xfffffffe;
            if (!bVar2) {
              uVar3 = uVar8;
            }
          }
          else {
            uVar3 = uVar8 - 1;
          }
        }
      }
      else {
        if (100 < uVar3) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format-inl.h"
                      ,0x407,"n is too large");
        }
        uVar3 = (uVar3 * 0xcccd >> 0x13) + uVar8 * 10;
      }
      goto LAB_0010f4d4;
    }
    if (uVar14 < uVar7) {
      if (((((uint)x & 1) != 0) && (uVar14 == 0)) &&
         (bVar2 = is_endpoint_integer<float>(two_f,uVar6,minus_k), bVar2)) {
        uVar14 = 100;
        uVar8 = (uVar3 >> 5) - 1;
        goto LAB_0010f44b;
      }
    }
    else if (((((uint)x & 1) != 0) ||
             (bVar2 = is_endpoint_integer<float>(two_f_00 - 1,uVar6,minus_k), !bVar2)) &&
            (bVar2 = cache_accessor<float>::compute_mul_parity(two_f_00 - 1,&local_38,beta_minus_1),
            uVar8 = uVar3 >> 5, !bVar2)) goto LAB_0010f44b;
    uVar8 = uVar3 >> 5 | 0x80;
    uVar6 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
      }
    }
    uVar8 = 0;
    uVar3 = uVar3 >> 5;
    if (1 < uVar6) {
      uVar8 = 0;
      do {
        uVar7 = (uint)uVar10 * -0x3d70a3d7;
        uVar3 = (uint)uVar10;
        if (0xa3d70a3 < uVar7) goto LAB_0010f420;
        uVar8 = uVar8 + 2;
        uVar10 = (ulong)uVar7;
      } while ((int)uVar8 < (int)(uVar6 - 1));
LAB_0010f41c:
      uVar8 = uVar6 & 0xfffffffe;
      uVar3 = uVar7;
    }
  }
  else {
    uVar6 = (((uint)x & 0x7f800000) >> 0x17) - 0x96;
    if (uVar3 != 0) {
      uVar3 = uVar3 | 0x800000;
      goto LAB_0010f20f;
    }
    uVar12 = (int)(uVar6 * 0x134413 + -0x7feff) >> 0x16;
    uVar13 = (ulong)uVar12;
    cVar5 = (char)((int)(uVar12 * -0x1a934f) >> 0x13) + (char)uVar6;
    uVar9 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                      (ulong)(0x1f - uVar12) * 8);
    bVar4 = 0x28 - cVar5;
    uVar8 = (uint)((uVar6 & 0xfffffffe) != 2) + (int)(uVar9 - (uVar9 >> 0x19) >> (bVar4 & 0x3f));
    uVar10 = (uVar9 >> 0x18) + uVar9 >> (bVar4 & 0x3f) & 0xffffffff;
    uVar11 = uVar10 / 10;
    uVar3 = (uint)uVar11;
    if ((uint)((int)(uVar10 / 10) * 10) < uVar8) {
      uVar3 = (int)(uVar9 >> (0x27U - cVar5 & 0x3f)) + 1U >> 1;
      if (uVar6 == 0xffffffdd) {
        uVar3 = uVar3 & 0xfffffffe;
      }
      else {
        uVar3 = uVar3 + (uVar3 < uVar8);
      }
      goto LAB_0010f4d4;
    }
    uVar8 = (uint)(uVar10 / 10) | 0x80;
    uVar6 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
      }
    }
    uVar8 = 0;
    if (1 < uVar6) {
      uVar8 = 0;
      do {
        uVar3 = (uint)uVar11;
        uVar7 = uVar3 * -0x3d70a3d7;
        if (0xa3d70a3 < uVar7) goto LAB_0010f420;
        uVar8 = uVar8 + 2;
        uVar11 = (ulong)uVar7;
      } while ((int)uVar8 < (int)(uVar6 - 1));
      goto LAB_0010f41c;
    }
  }
LAB_0010f420:
  if (uVar8 < uVar6) {
    uVar6 = uVar3 * -0x33333333;
    if (uVar6 < 0x33333334) {
      uVar3 = uVar6;
    }
    uVar8 = uVar8 | uVar6 < 0x33333334;
  }
  uVar13 = (ulong)(uVar12 + 1 + uVar8);
  uVar3 = uVar3 >> ((byte)uVar8 & 0x1f);
LAB_0010f4d4:
  return (decimal_fp<float>)((ulong)uVar3 | uVar13 << 0x20);
}

Assistant:

FMT_CONSTEXPR inline uint64_t multiply(uint64_t lhs, uint64_t rhs) {
#if FMT_USE_INT128
  auto product = static_cast<__uint128_t>(lhs) * rhs;
  auto f = static_cast<uint64_t>(product >> 64);
  return (static_cast<uint64_t>(product) & (1ULL << 63)) != 0 ? f + 1 : f;
#else
  // Multiply 32-bit parts of significands.
  uint64_t mask = (1ULL << 32) - 1;
  uint64_t a = lhs >> 32, b = lhs & mask;
  uint64_t c = rhs >> 32, d = rhs & mask;
  uint64_t ac = a * c, bc = b * c, ad = a * d, bd = b * d;
  // Compute mid 64-bit of result and round.
  uint64_t mid = (bd >> 32) + (ad & mask) + (bc & mask) + (1U << 31);
  return ac + (ad >> 32) + (bc >> 32) + (mid >> 32);
#endif
}